

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

void add_date(http_s *r)

{
  FIOBJ FVar1;
  FIOBJ FVar2;
  size_t size;
  FIOBJ FVar3;
  timespec tVar4;
  fio_lock_i ret;
  fio_str_info_s local_38;
  
  if (add_date::date_hash == 0) {
    add_date::date_hash = fiobj_hash_string("date",4);
  }
  if (add_date::mod_hash == 0) {
    add_date::mod_hash = fiobj_hash_string("last-modified",0xd);
  }
  tVar4 = fio_last_tick();
  if (last_date_added < tVar4.tv_sec) {
    fio_lock(&date_lock);
    tVar4 = fio_last_tick();
    if (last_date_added < tVar4.tv_sec) {
      FVar2 = fiobj_str_buf(0x20);
      FVar1 = current_date;
      fiobj_obj2cstr(&local_38,FVar2);
      tVar4 = fio_last_tick();
      size = http_time2str(local_38.data,tVar4.tv_sec);
      fiobj_str_resize(FVar2,size);
      tVar4 = fio_last_tick();
      last_date_added = tVar4.tv_sec;
      current_date = FVar2;
      fiobj_free(FVar1);
    }
    LOCK();
    date_lock = '\0';
    UNLOCK();
  }
  FVar3 = fiobj_hash_get2((r->private_data).out_headers,add_date::date_hash);
  FVar2 = HTTP_HEADER_DATE;
  FVar1 = current_date;
  if (FVar3 == 0) {
    FVar3 = (r->private_data).out_headers;
    fiobj_dup(current_date);
    fiobj_hash_set(FVar3,FVar2,FVar1);
  }
  if (r->status_str == 0) {
    FVar3 = fiobj_hash_get2((r->private_data).out_headers,add_date::mod_hash);
    FVar2 = HTTP_HEADER_LAST_MODIFIED;
    FVar1 = current_date;
    if (FVar3 == 0) {
      FVar3 = (r->private_data).out_headers;
      fiobj_dup(current_date);
      fiobj_hash_set(FVar3,FVar2,FVar1);
    }
  }
  return;
}

Assistant:

static inline void add_date(http_s *r) {
  static uint64_t date_hash = 0;
  if (!date_hash)
    date_hash = fiobj_hash_string("date", 4);
  static uint64_t mod_hash = 0;
  if (!mod_hash)
    mod_hash = fiobj_hash_string("last-modified", 13);

  if (fio_last_tick().tv_sec > last_date_added) {
    fio_lock(&date_lock);
    if (fio_last_tick().tv_sec > last_date_added) { /* retest inside lock */
      FIOBJ tmp = fiobj_str_buf(32);
      FIOBJ old = current_date;
      fiobj_str_resize(
          tmp, http_time2str(fiobj_obj2cstr(tmp).data, fio_last_tick().tv_sec));
      last_date_added = fio_last_tick().tv_sec;
      current_date = tmp;
      fiobj_free(old);
    }
    fio_unlock(&date_lock);
  }

  if (!fiobj_hash_get2(r->private_data.out_headers, date_hash)) {
    fiobj_hash_set(r->private_data.out_headers, HTTP_HEADER_DATE,
                   fiobj_dup(current_date));
  }
  if (r->status_str == FIOBJ_INVALID &&
      !fiobj_hash_get2(r->private_data.out_headers, mod_hash)) {
    fiobj_hash_set(r->private_data.out_headers, HTTP_HEADER_LAST_MODIFIED,
                   fiobj_dup(current_date));
  }
}